

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::StoreAnimations
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pPrefix)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  pointer ppAVar4;
  string animName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (pPrefix->_M_string_length == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (pSrcAnim->mName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (pSrcAnim->mName)._M_string_length);
  }
  else {
    pcVar1 = (pPrefix->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + pPrefix->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(pSrcAnim->mName)._M_dataplus._M_p);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar2[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  ppAVar4 = (pSrcAnim->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar4 !=
      (pSrcAnim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      StoreAnimations(this,pScene,pParser,*ppAVar4,&local_70);
      ppAVar4 = ppAVar4 + 1;
    } while (ppAVar4 !=
             (pSrcAnim->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateAnimation(this,pScene,pParser,pSrcAnim,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}